

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

bool __thiscall cmsys::RegularExpression::find(RegularExpression *this,char *string)

{
  char cVar1;
  char *__s2;
  size_t __n;
  int iVar2;
  char *__s1;
  char *pcVar3;
  
  this->searchstring = string;
  pcVar3 = this->program;
  if (pcVar3 != (char *)0x0) {
    if (*pcVar3 == -100) {
      __s2 = this->regmust;
      if (__s2 == (char *)0x0) {
LAB_0053f28d:
        regbol = string;
        if (this->reganch != '\0') {
          iVar2 = regtry(string,this->startp,this->endp,pcVar3);
          goto LAB_0053f27c;
        }
        if (this->regstart == '\0') {
          do {
            iVar2 = regtry(string,this->startp,this->endp,this->program);
            if (iVar2 != 0) break;
            cVar1 = *string;
            string = string + 1;
          } while (cVar1 != '\0');
          goto LAB_0053f27c;
        }
        pcVar3 = strchr(string,(int)this->regstart);
        if (pcVar3 != (char *)0x0) {
          do {
            iVar2 = regtry(pcVar3,this->startp,this->endp,this->program);
            if (iVar2 != 0) break;
            pcVar3 = strchr(pcVar3 + 1,(int)this->regstart);
          } while (pcVar3 != (char *)0x0);
          goto LAB_0053f27c;
        }
      }
      else {
        cVar1 = *__s2;
        __s1 = strchr(string,(int)cVar1);
        if (__s1 != (char *)0x0) {
          __n = this->regmlen;
          do {
            iVar2 = strncmp(__s1,__s2,__n);
            if (iVar2 == 0) goto LAB_0053f28d;
            __s1 = strchr(__s1 + 1,(int)cVar1);
          } while (__s1 != (char *)0x0);
        }
      }
    }
    else {
      puts("RegularExpression::find(): Compiled regular expression corrupted.");
    }
  }
  iVar2 = 0;
LAB_0053f27c:
  return SUB41(iVar2,0);
}

Assistant:

bool RegularExpression::find(const char* string)
{
  const char* s;

  this->searchstring = string;

  if (!this->program) {
    return false;
  }

  // Check validity of program.
  if (UCHARAT(this->program) != MAGIC) {
    // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf(
      "RegularExpression::find(): Compiled regular expression corrupted.\n");
    return 0;
  }

  // If there is a "must appear" string, look for it.
  if (this->regmust != 0) {
    s = string;
    while ((s = strchr(s, this->regmust[0])) != 0) {
      if (strncmp(s, this->regmust, this->regmlen) == 0)
        break; // Found it.
      s++;
    }
    if (s == 0) // Not present.
      return (0);
  }

  // Mark beginning of line for ^ .
  regbol = string;

  // Simplest case:  anchored match need be tried only once.
  if (this->reganch)
    return (regtry(string, this->startp, this->endp, this->program) != 0);

  // Messy cases:  unanchored match.
  s = string;
  if (this->regstart != '\0')
    // We know what char it must start with.
    while ((s = strchr(s, this->regstart)) != 0) {
      if (regtry(s, this->startp, this->endp, this->program))
        return (1);
      s++;
    }
  else
    // We don't -- general case.
    do {
      if (regtry(s, this->startp, this->endp, this->program))
        return (1);
    } while (*s++ != '\0');

  // Failure.
  return (0);
}